

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SchemaErrorValue(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *this,SchemaErrorCode code,PointerType *location,Ch *value,SizeType length)

{
  StringRefType *rhs;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *value_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_60;
  GenericStringRef<char> local_50;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_40;
  SizeType local_2c;
  Ch *pCStack_28;
  SizeType length_local;
  Ch *value_local;
  PointerType *location_local;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *pGStack_10;
  SchemaErrorCode code_local;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  local_2c = length;
  pCStack_28 = value;
  value_local = (Ch *)location;
  location_local._4_4_ = code;
  pGStack_10 = this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue(&local_40,kObjectType);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
            (&this->currentError_,&local_40);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_40);
  rhs = GetValueString();
  GenericStringRef<char>::GenericStringRef(&local_50,rhs);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            (&local_60,pCStack_28,local_2c,this->allocator_);
  value_00 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_60);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&local_50,value_00,this->allocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_60);
  AddCurrentError(this,location_local._4_4_,(PointerType *)value_local);
  return;
}

Assistant:

void SchemaErrorValue(const SchemaErrorCode code, const PointerType& location, const Ch* value, SizeType length) {
      currentError_ = GValue(kObjectType);
      currentError_.AddMember(GetValueString(), GValue(value, length, *allocator_).Move(), *allocator_);
      AddCurrentError(code, location);
    }